

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O1

void __thiscall bsplib::Rdma::PushPopCommBuf::execute(PushPopCommBuf *this,Rdma *rdma)

{
  long *plVar1;
  undefined8 *puVar2;
  uint uVar3;
  pointer pPVar4;
  Memslot MVar5;
  pointer pMVar6;
  _Hash_node_base *p_Var7;
  _Hash_node_base *p_Var8;
  long *plVar9;
  uchar *puVar10;
  iterator __position;
  uchar *puVar11;
  pointer puVar12;
  __node_base_ptr p_Var13;
  __node_base_ptr p_Var14;
  exception *peVar15;
  ulong uVar16;
  Memslot *pMVar17;
  long *plVar18;
  long lVar19;
  ulong uVar20;
  uchar *puVar21;
  _Node_iterator_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
  __it;
  ulong uVar22;
  __node_base_ptr p_Var23;
  uint *puVar24;
  long *plVar25;
  long lVar26;
  unsigned_long local_208;
  ulong local_200;
  ulong local_1f8;
  PushPopCommBuf *local_1f0;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_1e8;
  _Hashtable<void_*,_std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_1e0;
  long local_1d8;
  exception local_1d0;
  
  local_1d8 = (long)rdma->m_pid;
  uVar3 = rdma->m_nprocs;
  local_200 = (ulong)(int)uVar3;
  local_1f8 = (ulong)uVar3;
  pPVar4 = (this->m_pushed_slots).
           super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar16 = (long)(this->m_pushed_slots).
                 super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar4 >> 5;
  local_1f0 = this;
  if (local_200 <= uVar16) {
    pMVar17 = &pPVar4->slot;
    uVar22 = 0;
    do {
      if (0 < (int)uVar3) {
        MVar5 = pPVar4[uVar22 * local_200].slot;
        puVar24 = (uint *)((long)&((rdma->m_used_slots).
                                   super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->status +
                          local_200 * 0x18 * MVar5);
        lVar26 = 0;
        do {
          if (*(Memslot *)((long)pMVar17 + lVar26) != MVar5) {
            peVar15 = (exception *)__cxa_allocate_exception(0x1a0);
            exception::exception(&local_1d0,"bsp_push_reg");
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1d0.m_stream,"Internal error; inconsistent slot id",0x24);
            exception::exception(peVar15,&local_1d0);
            __cxa_throw(peVar15,&exception::typeinfo,exception::~exception);
          }
          ((Memblock *)(puVar24 + 0xfffffffffffffffc))->addr =
               (void *)*(undefined8 *)((long)pMVar17 + lVar26 + -0x18);
          *(size_t *)(puVar24 + 0xfffffffffffffffe) = *(size_t *)((long)pMVar17 + lVar26 + -0x10);
          *(byte *)puVar24 = (byte)*puVar24 & 0xfe;
          lVar26 = lVar26 + 0x20;
          puVar24 = puVar24 + 6;
        } while (local_1f8 << 5 != lVar26);
      }
      uVar22 = uVar22 + 1;
      pMVar17 = pMVar17 + local_200 * 4;
    } while (uVar22 < uVar16 / local_200);
  }
  puVar12 = (this->m_popped_slots).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_popped_slots).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar12) {
    local_1e0 = &(rdma->m_register)._M_h;
    local_1e8 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&rdma->m_free_slots;
    uVar16 = 0;
    do {
      local_208 = puVar12[uVar16];
      if (local_208 == 0xffffffffffffffff) {
        p_Var13 = *(rdma->m_register)._M_h._M_buckets;
        if (p_Var13 == (__node_base_ptr)0x0) {
LAB_0010be59:
          p_Var13 = (__node_base_ptr)0x0;
        }
        else if (p_Var13->_M_nxt[1]._M_nxt != (_Hash_node_base *)0x0) {
          p_Var14 = p_Var13->_M_nxt;
          do {
            p_Var7 = p_Var14->_M_nxt;
            if (p_Var7 == (_Hash_node_base *)0x0) goto LAB_0010be59;
            p_Var13 = (__node_base_ptr)0x0;
          } while (((ulong)p_Var7[1]._M_nxt % (rdma->m_register)._M_h._M_bucket_count == 0) &&
                  (p_Var13 = p_Var14, p_Var14 = p_Var7, p_Var7[1]._M_nxt != (_Hash_node_base *)0x0))
          ;
        }
        if (p_Var13 == (__node_base_ptr)0x0) {
          __it._M_cur = (__node_type *)0x0;
        }
        else {
          __it._M_cur = (__node_type *)p_Var13->_M_nxt;
        }
        if (__it._M_cur == (__node_type *)0x0) {
          peVar15 = (exception *)__cxa_allocate_exception(0x1a0);
          exception::exception(&local_1d0,"bsp_pop_reg");
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1d0.m_stream,
                     "Tried to deregister NULL on all processes, but NULL was never registered",0x48
                    );
          exception::exception(peVar15,&local_1d0);
          __cxa_throw(peVar15,&exception::typeinfo,exception::~exception);
        }
        plVar1 = (long *)((long)&((__it._M_cur)->
                                 super__Hash_node_value<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                                 ).
                                 super__Hash_node_value_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 ._M_storage._M_storage + 8);
        plVar9 = *(long **)((long)&((__it._M_cur)->
                                   super__Hash_node_value<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                                   ).
                                   super__Hash_node_value_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                   ._M_storage._M_storage + 8);
        plVar25 = plVar9;
        if (plVar9 != plVar1) {
          plVar18 = plVar9;
          while( true ) {
            local_208 = plVar18[2];
            plVar25 = plVar9;
            if ((int)local_200 < 1) break;
            lVar26 = 0;
            while (*(long *)((long)&(rdma->m_used_slots).
                                    super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>
                                    ._M_impl.super__Vector_impl_data._M_start
                                    [local_208 * (long)rdma->m_nprocs].addr + lVar26) == 0) {
              lVar26 = lVar26 + 0x18;
              plVar25 = plVar18;
              if ((ulong)uVar3 * 0x18 == lVar26) goto LAB_0010bed0;
            }
            plVar18 = (long *)*plVar18;
            plVar25 = plVar18;
            if (plVar18 == plVar1) break;
          }
        }
LAB_0010bed0:
        if (plVar25 == plVar1) {
          peVar15 = (exception *)__cxa_allocate_exception(0x1a0);
          exception::exception(&local_1d0,"bsp_pop_reg");
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1d0.m_stream,
                     "Tried to deregister NULL on all processes, but could not find a matching regisration (bsp_push_reg)"
                     ,99);
          exception::exception(peVar15,&local_1d0);
          __cxa_throw(peVar15,&exception::typeinfo,exception::~exception);
        }
      }
      else {
        lVar26 = (long)rdma->m_nprocs * local_208;
        pMVar6 = (rdma->m_used_slots).
                 super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        p_Var7 = (_Hash_node_base *)pMVar6[lVar26 + local_1d8].addr;
        if ((p_Var7 != (_Hash_node_base *)0x0) && ((pMVar6[lVar26 + local_1d8].status & 2) == 0)) {
          __assert_fail("rdma.slot(pid,id).addr == NULL || rdma.slot( pid, id ).status & Memblock::POPPED"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/rdma.cc"
                        ,0x1fe,"void bsplib::Rdma::PushPopCommBuf::execute(Rdma &)");
        }
        uVar22 = (rdma->m_register)._M_h._M_bucket_count;
        uVar20 = (ulong)p_Var7 % uVar22;
        p_Var13 = (rdma->m_register)._M_h._M_buckets[uVar20];
        p_Var14 = (__node_base_ptr)0x0;
        if ((p_Var13 != (__node_base_ptr)0x0) &&
           (p_Var14 = p_Var13, p_Var23 = p_Var13->_M_nxt, p_Var7 != p_Var13->_M_nxt[1]._M_nxt)) {
          while (p_Var8 = p_Var23->_M_nxt, p_Var8 != (_Hash_node_base *)0x0) {
            p_Var14 = (__node_base_ptr)0x0;
            if (((ulong)p_Var8[1]._M_nxt % uVar22 != uVar20) ||
               (p_Var14 = p_Var23, p_Var23 = p_Var8, p_Var7 == p_Var8[1]._M_nxt)) goto LAB_0010bedc;
          }
          p_Var14 = (__node_base_ptr)0x0;
        }
LAB_0010bedc:
        if (p_Var14 == (__node_base_ptr)0x0) {
          __it._M_cur = (__node_type *)0x0;
        }
        else {
          __it._M_cur = (__node_type *)p_Var14->_M_nxt;
        }
        if (__it._M_cur == (__node_type *)0x0) {
          __assert_fail("reg_entry != rdma.m_register.end()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/rdma.cc"
                        ,0x201,"void bsplib::Rdma::PushPopCommBuf::execute(Rdma &)");
        }
        puVar10 = *(uchar **)
                   ((long)&((__it._M_cur)->
                           super__Hash_node_value<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                           ).
                           super__Hash_node_value_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_storage._M_storage + 8);
        puVar11 = ((__it._M_cur)->
                  super__Hash_node_value<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                  ).
                  super__Hash_node_value_base<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_storage._M_storage.__data + 8;
        do {
          puVar21 = puVar11;
          if (puVar21 == puVar10) break;
          puVar11 = *(uchar **)(puVar21 + 8);
        } while (*(unsigned_long *)(*(uchar **)(puVar21 + 8) + 0x10) != local_208);
        if (puVar21 == puVar10) {
          peVar15 = (exception *)__cxa_allocate_exception(0x1a0);
          exception::exception(&local_1d0,"bsp_pop_reg");
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1d0.m_stream,"Internal error: inconsistent slot id",0x24);
          exception::exception(peVar15,&local_1d0);
          __cxa_throw(peVar15,&exception::typeinfo,exception::~exception);
        }
        plVar25 = *(long **)(puVar21 + 8);
      }
      if (plVar25[2] != local_208) {
        __assert_fail("*rs == id",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/rdma.cc"
                      ,0x22d,"void bsplib::Rdma::PushPopCommBuf::execute(Rdma &)");
      }
      *(long *)((long)__it._M_cur + 0x20) = *(long *)((long)__it._M_cur + 0x20) + -1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(plVar25,0x18);
      if (*(long *)((long)__it._M_cur + 0x10) == (long)__it._M_cur + 0x10) {
        std::
        _Hashtable<void_*,_std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::erase(local_1e0,(const_iterator)__it._M_cur);
      }
      if (0 < (int)local_1f8) {
        lVar26 = (long)rdma->m_nprocs * local_208;
        pMVar6 = (rdma->m_used_slots).
                 super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar19 = 0;
        do {
          puVar2 = (undefined8 *)((long)&pMVar6[lVar26].addr + lVar19);
          *puVar2 = 0;
          puVar2[1] = 0;
          *(undefined4 *)((long)&pMVar6[lVar26].status + lVar19) = 0;
          lVar19 = lVar19 + 0x18;
        } while ((ulong)uVar3 * 0x18 != lVar19);
      }
      __position._M_current =
           (rdma->m_free_slots).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (rdma->m_free_slots).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>(local_1e8,__position,&local_208);
      }
      else {
        *__position._M_current = local_208;
        (rdma->m_free_slots).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar16 = uVar16 + 1;
      puVar12 = (local_1f0->m_popped_slots).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar16 < (ulong)((long)(local_1f0->m_popped_slots).
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12 >> 3)
            );
  }
  return;
}

Assistant:

void Rdma::PushPopCommBuf::execute( Rdma & rdma ) 
{
    const int pid = rdma.m_pid;
    const int nprocs = rdma.m_nprocs;
 
    /* do memory registrations */
    for (size_t s = 0; s < m_pushed_slots.size()/nprocs; ++s) {
        Memslot id = m_pushed_slots[s*nprocs].slot;

        for ( int p = 0 ; p < nprocs; ++p ) {
            if ( m_pushed_slots[ s*nprocs + p ].slot != id )
                throw exception("bsp_push_reg") << "Internal error; inconsistent slot id";

            rdma.slot( p, id ).addr = m_pushed_slots[ s*nprocs + p ].block.addr;
            rdma.slot( p, id ).size = m_pushed_slots[ s*nprocs + p ].block.size;
            rdma.slot( p, id ).status &= ~Memblock::PUSHED; 
        }
    }

    /* do memory deregistrations */
    for (size_t s = 0; s < m_popped_slots.size(); ++s) {
        Memslot id = m_popped_slots[s];

        Reg::iterator reg_entry;
        RegStack :: iterator rs; 

        if ( id != no_slot() ) {
            assert( rdma.slot(pid,id).addr == NULL
                   || rdma.slot( pid, id ).status & Memblock::POPPED );
            void * addr = rdma.slot( pid, id).addr;
            reg_entry = rdma.m_register.find( addr );
            assert( reg_entry != rdma.m_register.end() );
            RegStack & stack = reg_entry->second;
            RegStack :: reverse_iterator j ; 
            for (j = stack.rbegin(); j != stack.rend(); ++j )
                if ( *j == id ) break;

            if ( j == stack.rend() )
                throw exception("bsp_pop_reg") << "Internal error: inconsistent slot id";

            rs = j.base();
            --rs;
        }
        else
        { // then all processes have popped NULL
          // Let's delete the first full block of NULL we can encounter

            reg_entry = rdma.m_register.find( NULL );
            if( reg_entry == rdma.m_register.end() )
                throw exception("bsp_pop_reg") <<
                    "Tried to deregister NULL on all processes, but NULL was never registered";

            RegStack & stack = reg_entry->second;

            for ( rs = stack.begin(); rs != stack.end(); ++rs ) {

                id = *rs;

                bool all_nulls = true;
                for ( int p = 0; p < nprocs; ++p ) {
                    if ( rdma.slot( p, id ).addr != NULL ) {
                        all_nulls = false;
                        break;
                    }
                }

                if ( all_nulls ) {
                   break;
                }
            }
            if ( rs == stack.end() ) 
                throw exception("bsp_pop_reg") <<
                    "Tried to deregister NULL on all processes, but could not find a matching regisration (bsp_push_reg)";
        }

        assert( *rs == id );
        reg_entry->second.erase( rs );

        if ( reg_entry->second.empty())
            rdma.m_register.erase( reg_entry );

        for (int p = 0; p < nprocs; ++p) {
            rdma.slot( p, id ).addr = NULL;
            rdma.slot( p, id ).size = 0;
            rdma.slot( p, id ).status = Memblock::NORMAL;
        }
        rdma.m_free_slots.push_back( id );
    }
}